

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleRelativePathCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  cmMakefile *this_00;
  bool bVar2;
  size_type sVar3;
  const_reference name;
  const_reference __rhs;
  const_reference __rhs_00;
  char *pcVar4;
  cmSystemTools *this_01;
  char *in_RCX;
  undefined1 local_d0 [8];
  string res;
  string errstring_1;
  string errstring;
  string *fileName;
  string *directoryName;
  string *outVar;
  allocator local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 == 4) {
    name = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_20,1);
    __rhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](local_20,2);
    __rhs_00 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_20,3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar4);
    if (bVar2) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar4);
      if (bVar2) {
        this_01 = (cmSystemTools *)std::__cxx11::string::c_str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmSystemTools::RelativePath_abi_cxx11_((string *)local_d0,this_01,pcVar4,in_RCX);
        this_00 = (this->super_cmCommand).Makefile;
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(this_00,name,pcVar4);
        this_local._7_1_ = 1;
        std::__cxx11::string::~string((string *)local_d0);
      }
      else {
        pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&res.field_2 + 8);
        std::operator+(pbVar1,"RELATIVE_PATH must be passed a full path to the file: ",__rhs_00);
        cmCommand::SetError(&this->super_cmCommand,pbVar1);
        this_local._7_1_ = 0;
        std::__cxx11::string::~string((string *)(res.field_2._M_local_buf + 8));
      }
    }
    else {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&errstring_1.field_2 + 8);
      std::operator+(pbVar1,"RELATIVE_PATH must be passed a full path to the directory: ",__rhs);
      cmCommand::SetError(&this->super_cmCommand,pbVar1);
      this_local._7_1_ = 0;
      std::__cxx11::string::~string((string *)(errstring_1.field_2._M_local_buf + 8));
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"RELATIVE_PATH called with incorrect number of arguments",
               &local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCommand::HandleRelativePathCommand(
  std::vector<std::string> const& args)
{
  if(args.size() != 4 )
    {
    this->SetError("RELATIVE_PATH called with incorrect number of arguments");
    return false;
    }

  const std::string& outVar = args[1];
  const std::string& directoryName = args[2];
  const std::string& fileName = args[3];

  if(!cmSystemTools::FileIsFullPath(directoryName.c_str()))
    {
    std::string errstring =
      "RELATIVE_PATH must be passed a full path to the directory: "
      + directoryName;
    this->SetError(errstring);
    return false;
    }
  if(!cmSystemTools::FileIsFullPath(fileName.c_str()))
    {
    std::string errstring =
      "RELATIVE_PATH must be passed a full path to the file: "
      + fileName;
    this->SetError(errstring);
    return false;
    }

  std::string res = cmSystemTools::RelativePath(directoryName.c_str(),
                                                fileName.c_str());
  this->Makefile->AddDefinition(outVar,
    res.c_str());
  return true;
}